

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.hpp
# Opt level: O0

void trial::protocol::serialization::
     save_overloader<trial::protocol::json::basic_oarchive<char>,_std::map<int,_bool,_std::less<int>,_std::allocator<std::pair<const_int,_bool>_>_>,_void>
     ::save(basic_oarchive<char> *archive,
           map<int,_bool,_std::less<int>,_std::allocator<std::pair<const_int,_bool>_>_> *data,
           uint protocol_version)

{
  bool bVar1;
  reference data_00;
  _Self local_30;
  _Self local_28;
  const_iterator it;
  uint protocol_version_local;
  map<int,_bool,_std::less<int>,_std::allocator<std::pair<const_int,_bool>_>_> *data_local;
  basic_oarchive<char> *archive_local;
  
  it._M_node._4_4_ = protocol_version;
  json::basic_oarchive<char>::save<trial::protocol::json::token::begin_array>(archive);
  local_28._M_node =
       (_Base_ptr)
       std::map<int,_bool,_std::less<int>,_std::allocator<std::pair<const_int,_bool>_>_>::begin
                 (data);
  while( true ) {
    local_30._M_node =
         (_Base_ptr)
         std::map<int,_bool,_std::less<int>,_std::allocator<std::pair<const_int,_bool>_>_>::end
                   (data);
    bVar1 = std::operator!=(&local_28,&local_30);
    if (!bVar1) break;
    data_00 = std::_Rb_tree_const_iterator<std::pair<const_int,_bool>_>::operator*(&local_28);
    json::basic_oarchive<char>::save_override<std::pair<int_const,bool>>
              (archive,data_00,(ulong)it._M_node._4_4_);
    std::_Rb_tree_const_iterator<std::pair<const_int,_bool>_>::operator++(&local_28);
  }
  json::basic_oarchive<char>::save<trial::protocol::json::token::end_array>(archive);
  return;
}

Assistant:

static void save(json::basic_oarchive<CharT>& archive,
                     const std::map<Key, T, Compare, Allocator>& data,
                     const unsigned int protocol_version)
    {
        archive.template save<json::token::begin_array>();
        for (typename std::map<Key, T, Compare, Allocator>::const_iterator it = data.begin();
             it != data.end();
             ++it)
        {
            archive.save_override(*it, protocol_version);
        }
        archive.template save<json::token::end_array>();
    }